

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Electron.cpp
# Opt level: O0

HalfCycles __thiscall
Electron::ConcreteMachine<true>::get_typer_delay(ConcreteMachine<true> *this,string *text)

{
  bool bVar1;
  char *pcVar2;
  Cycles local_50 [3];
  Key *local_38;
  uint16_t *sequence;
  CharacterMapper test_mapper;
  string *text_local;
  ConcreteMachine<true> *this_local;
  
  bVar1 = CPU::MOS6502::ProcessorBase::get_is_resetting(&(this->m6502_).super_ProcessorBase);
  if (bVar1) {
    CharacterMapper::CharacterMapper((CharacterMapper *)&sequence);
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)text);
    local_38 = CharacterMapper::sequence_for_character((CharacterMapper *)&sequence,*pcVar2);
    bVar1 = is_modifier(*local_38);
    if (bVar1) {
      Cycles::Cycles(local_50,1000000);
    }
    else {
      Cycles::Cycles(local_50,750000);
    }
    HalfCycles::HalfCycles((HalfCycles *)&this_local,local_50);
    CharacterMapper::~CharacterMapper((CharacterMapper *)&sequence);
  }
  else {
    Cycles::Cycles((Cycles *)&test_mapper,0);
    HalfCycles::HalfCycles((HalfCycles *)&this_local,(Cycles *)&test_mapper);
  }
  return (HalfCycles)(WrappedInt<HalfCycles>)this_local;
}

Assistant:

HalfCycles get_typer_delay(const std::string &text) const final {
			if(!m6502_.get_is_resetting()) {
				return Cycles(0);
			}

			// Add a longer delay for a command at reset that involves pressing a modifier;
			// empirically this seems to be a requirement, in order to avoid a collision with
			// the system's built-in modifier-at-startup test (e.g. to perform shift+break).
			CharacterMapper test_mapper;
			const uint16_t *const sequence = test_mapper.sequence_for_character(text[0]);
			return is_modifier(Key(sequence[0])) ? Cycles(1'000'000) : Cycles(750'000);
		}